

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O1

isminetype wallet::InputIsMine(CWallet *wallet,CTxIn *txin)

{
  long lVar1;
  element_type *peVar2;
  pointer pCVar3;
  isminetype iVar4;
  CWalletTx *pCVar5;
  ulong uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar5 = CWallet::GetWalletTx(wallet,(uint256 *)txin);
  if (pCVar5 != (CWalletTx *)0x0) {
    uVar6 = (ulong)(txin->prevout).n;
    peVar2 = (pCVar5->tx).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pCVar3 = (peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = ((long)(peVar2->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pCVar3 >> 3) * -0x3333333333333333;
    if (uVar6 <= uVar7 && uVar7 - uVar6 != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        iVar4 = CWallet::IsMine(wallet,pCVar3 + uVar6);
        return iVar4;
      }
      goto LAB_004c1aa5;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return ISMINE_NO;
  }
LAB_004c1aa5:
  __stack_chk_fail();
}

Assistant:

isminetype InputIsMine(const CWallet& wallet, const CTxIn& txin)
{
    AssertLockHeld(wallet.cs_wallet);
    const CWalletTx* prev = wallet.GetWalletTx(txin.prevout.hash);
    if (prev && txin.prevout.n < prev->tx->vout.size()) {
        return wallet.IsMine(prev->tx->vout[txin.prevout.n]);
    }
    return ISMINE_NO;
}